

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# x_time.c
# Opt level: O0

void * pipe_new(t_symbol *s,int argc,t_atom *argv)

{
  char cVar1;
  _outlet *p_Var2;
  char local_b8 [7];
  char c;
  char stupid [80];
  int local_60;
  t_float deltime;
  int i;
  int nptr;
  t_gpointer *gp;
  t_pipeout *vp;
  t_pipeout *vec;
  t_atom *ap;
  t_atom defarg;
  t_pipe *x;
  t_atom *argv_local;
  int argc_local;
  t_symbol *s_local;
  
  defarg.a_w.w_symbol = (t_symbol *)pd_new(pipe_class);
  deltime = 0.0;
  if (argc == 0) {
    stupid[0x4c] = '\0';
    stupid[0x4d] = '\0';
    stupid[0x4e] = '\0';
    stupid[0x4f] = '\0';
    argv_local._4_4_ = 0;
  }
  else {
    if (argv[argc + -1].a_type == A_FLOAT) {
      stupid._76_4_ = argv[argc + -1].a_w.w_float;
    }
    else {
      atom_string(argv + (argc + -1),local_b8,0x4f);
      pd_error(defarg.a_w.w_symbol,"pipe: %s: bad time delay value",local_b8);
      stupid[0x4c] = '\0';
      stupid[0x4d] = '\0';
      stupid[0x4e] = '\0';
      stupid[0x4f] = '\0';
    }
    argv_local._4_4_ = argc + -1;
  }
  x = (t_pipe *)argv;
  if (argv_local._4_4_ == 0) {
    x = (t_pipe *)&ap;
    argv_local._4_4_ = 1;
    ap._0_4_ = 1;
    defarg.a_type = A_NULL;
  }
  *(int *)&((defarg.a_w.w_array)->a_gp).gp_stub = argv_local._4_4_;
  gp = (t_gpointer *)getbytes((long)argv_local._4_4_ * 0x18);
  defarg.a_w.w_symbol[2].s_next = (_symbol *)gp;
  local_60 = argv_local._4_4_;
  vec = (t_pipeout *)x;
  while (local_60 != 0) {
    if (((vec->p_atom).a_type == A_SYMBOL) && (*((vec->p_atom).a_w.w_symbol)->s_name == 'p')) {
      deltime = (t_float)((int)deltime + 1);
    }
    vec = (t_pipeout *)&vec->p_outlet;
    local_60 = local_60 + -1;
  }
  _i = (t_gpointer *)getbytes((long)(int)deltime * 0x18);
  defarg.a_w.w_symbol[3].s_name = (char *)_i;
  *(t_float *)((long)&((defarg.a_w.w_array)->a_gp).gp_stub + 4) = deltime;
  vec = (t_pipeout *)x;
  for (local_60 = 0; local_60 < argv_local._4_4_; local_60 = local_60 + 1) {
    if ((vec->p_atom).a_type == A_FLOAT) {
      gp->gp_un = *(anon_union_8_2_4cf7151e_for_gp_un *)&vec->p_atom;
      *(word *)&gp->gp_valid = (vec->p_atom).a_w;
      p_Var2 = outlet_new((t_object *)defarg.a_w.w_symbol,&s_float);
      gp->gp_stub = (t_gstub *)p_Var2;
      if (local_60 != 0) {
        floatinlet_new((t_object *)defarg.a_w.w_symbol,(t_float *)&gp->gp_valid);
      }
    }
    else if ((vec->p_atom).a_type == A_SYMBOL) {
      cVar1 = *((vec->p_atom).a_w.w_symbol)->s_name;
      if (cVar1 == 's') {
        *(undefined4 *)&gp->gp_un = 2;
        *(t_symbol **)&gp->gp_valid = &s_symbol;
        p_Var2 = outlet_new((t_object *)defarg.a_w.w_symbol,&s_symbol);
        gp->gp_stub = (t_gstub *)p_Var2;
        if (local_60 != 0) {
          symbolinlet_new((t_object *)defarg.a_w.w_symbol,(t_symbol **)&gp->gp_valid);
        }
      }
      else if (cVar1 == 'p') {
        *(undefined4 *)&gp->gp_un = 3;
        *(t_gpointer **)&gp->gp_valid = _i;
        gpointer_init(_i);
        p_Var2 = outlet_new((t_object *)defarg.a_w.w_symbol,&s_pointer);
        gp->gp_stub = (t_gstub *)p_Var2;
        if (local_60 != 0) {
          pointerinlet_new((t_object *)defarg.a_w.w_symbol,_i);
        }
        _i = _i + 1;
      }
      else {
        if (cVar1 != 'f') {
          pd_error(defarg.a_w.w_symbol,"pipe: %s: bad type",((vec->p_atom).a_w.w_symbol)->s_name);
        }
        *(undefined4 *)&gp->gp_un = 1;
        gp->gp_valid = 0;
        p_Var2 = outlet_new((t_object *)defarg.a_w.w_symbol,&s_float);
        gp->gp_stub = (t_gstub *)p_Var2;
        if (local_60 != 0) {
          floatinlet_new((t_object *)defarg.a_w.w_symbol,(t_float *)&gp->gp_valid);
        }
      }
    }
    vec = (t_pipeout *)&vec->p_outlet;
    gp = gp + 1;
  }
  floatinlet_new((t_object *)defarg.a_w.w_symbol,(t_float *)&(defarg.a_w.w_array)->a_stub);
  defarg.a_w.w_symbol[3].s_thing = (_class **)0x0;
  *(undefined4 *)&(defarg.a_w.w_array)->a_stub = stupid._76_4_;
  return defarg.a_w.w_symbol;
}

Assistant:

static void *pipe_new(t_symbol *s, int argc, t_atom *argv)
{
    t_pipe *x = (t_pipe *)pd_new(pipe_class);
    t_atom defarg, *ap;
    t_pipeout *vec, *vp;
    t_gpointer *gp;
    int nptr = 0;
    int i;
    t_float deltime;
    if (argc)
    {
        if (argv[argc-1].a_type != A_FLOAT)
        {
            char stupid[80];
            atom_string(&argv[argc-1], stupid, 79);
            pd_error(x, "pipe: %s: bad time delay value", stupid);
            deltime = 0;
        }
        else deltime = argv[argc-1].a_w.w_float;
        argc--;
    }
    else deltime = 0;
    if (!argc)
    {
        argv = &defarg;
        argc = 1;
        SETFLOAT(&defarg, 0);
    }
    x->x_n = argc;
    vec = x->x_vec = (t_pipeout *)getbytes(argc * sizeof(*x->x_vec));

    for (i = argc, ap = argv; i--; ap++)
        if (ap->a_type == A_SYMBOL && *ap->a_w.w_symbol->s_name == 'p')
            nptr++;

    gp = x->x_gp = (t_gpointer *)t_getbytes(nptr * sizeof (*gp));
    x->x_nptr = nptr;

    for (i = 0, vp = vec, ap = argv; i < argc; i++, ap++, vp++)
    {
        if (ap->a_type == A_FLOAT)
        {
            vp->p_atom = *ap;
            vp->p_outlet = outlet_new(&x->x_obj, &s_float);
            if (i) floatinlet_new(&x->x_obj, &vp->p_atom.a_w.w_float);
        }
        else if (ap->a_type == A_SYMBOL)
        {
            char c = *ap->a_w.w_symbol->s_name;
            if (c == 's')
            {
                SETSYMBOL(&vp->p_atom, &s_symbol);
                vp->p_outlet = outlet_new(&x->x_obj, &s_symbol);
                if (i) symbolinlet_new(&x->x_obj, &vp->p_atom.a_w.w_symbol);
            }
            else if (c == 'p')
            {
                vp->p_atom.a_type = A_POINTER;
                vp->p_atom.a_w.w_gpointer = gp;
                gpointer_init(gp);
                vp->p_outlet = outlet_new(&x->x_obj, &s_pointer);
                if (i) pointerinlet_new(&x->x_obj, gp);
                gp++;
            }
            else
            {
                if (c != 'f') pd_error(x, "pipe: %s: bad type",
                    ap->a_w.w_symbol->s_name);
                SETFLOAT(&vp->p_atom, 0);
                vp->p_outlet = outlet_new(&x->x_obj, &s_float);
                if (i) floatinlet_new(&x->x_obj, &vp->p_atom.a_w.w_float);
            }
        }
    }
    floatinlet_new(&x->x_obj, &x->x_deltime);
    x->x_hang = 0;
    x->x_deltime = deltime;
    return (x);
}